

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void uECC_decompress(uint8_t *compressed,uint8_t *public_key,uECC_Curve curve)

{
  uECC_word_t *result;
  uECC_word_t *y;
  uECC_word_t point [8];
  uECC_Curve curve_local;
  uint8_t *public_key_local;
  uint8_t *compressed_local;
  
  result = point + (long)(int)curve->num_words + -1;
  uECC_vli_bytesToNative((uECC_word_t *)&y,compressed + 1,(int)curve->num_bytes);
  (*curve->x_side)(result,(uECC_word_t *)&y,curve);
  (*curve->mod_sqrt)(result,curve);
  if ((*result & 1) != (long)(int)(*compressed & 1)) {
    uECC_vli_sub(result,curve->p,result,curve->num_words);
  }
  uECC_vli_nativeToBytes(public_key,(int)curve->num_bytes,(uECC_word_t *)&y);
  uECC_vli_nativeToBytes(public_key + (int)curve->num_bytes,(int)curve->num_bytes,result);
  return;
}

Assistant:

void uECC_decompress(const uint8_t *compressed, uint8_t *public_key, uECC_Curve curve) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *point = (uECC_word_t *)public_key;
#else
    uECC_word_t point[uECC_MAX_WORDS * 2];
#endif
    uECC_word_t *y = point + curve->num_words;
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy(public_key, compressed+1, curve->num_bytes);
#else
    uECC_vli_bytesToNative(point, compressed + 1, curve->num_bytes);
#endif
    curve->x_side(y, point, curve);
    curve->mod_sqrt(y, curve);

    if ((y[0] & 0x01) != (compressed[0] & 0x01)) {
        uECC_vli_sub(y, curve->p, y, curve->num_words);
    }

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_nativeToBytes(public_key, curve->num_bytes, point);
    uECC_vli_nativeToBytes(public_key + curve->num_bytes, curve->num_bytes, y);
#endif
}